

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O1

Aig_Man_t * Saig_ManIsoReduce(Aig_Man_t *pAig,Vec_Ptr_t **pvPosEquivs,int fVerbose)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  Aig_Man_t *pAVar4;
  long lVar5;
  int level;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  timespec ts;
  timespec local_48;
  Aig_Man_t *local_38;
  
  iVar3 = clock_gettime(3,&local_48);
  if (iVar3 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  pAVar4 = Iso_ManFilterPos(pAig,pvPosEquivs,fVerbose);
  printf("Reduced %d outputs to %d outputs.  ",(ulong)(uint)pAig->nTruePos,
         (ulong)(uint)pAVar4->nTruePos);
  level = 3;
  iVar3 = clock_gettime(3,&local_48);
  if (iVar3 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  local_38 = pAVar4;
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar6 + lVar5) / 1000000.0);
  if (((fVerbose != 0) && (*pvPosEquivs != (Vec_Ptr_t *)0x0)) &&
     (pAig->nTruePos != (*pvPosEquivs)->nSize)) {
    puts("Nontrivial classes:");
    pVVar2 = *pvPosEquivs;
    if (0 < pVVar2->nSize) {
      uVar7 = 0;
      do {
        if ((long)pVVar2->nSize <= (long)uVar7) {
LAB_0062723a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                        ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
        }
        uVar8 = 0;
        while( true ) {
          iVar3 = *(int *)((long)pVVar2->pArray[uVar7] + 4);
          if (((long)iVar3 <= (long)uVar8) || (iVar3 == 1)) break;
          uVar1 = *(uint *)(*(long *)((long)pVVar2->pArray[uVar7] + 8) + uVar8 * 4);
          if (uVar8 == 0) {
            printf(" %4d : {",uVar7 & 0xffffffff);
          }
          printf(" %d",(ulong)uVar1);
          if ((long)pVVar2->nSize <= (long)uVar7) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                          ,0x100,"int Vec_VecLevelSize(Vec_Vec_t *, int)");
          }
          if (uVar8 == *(int *)((long)pVVar2->pArray[uVar7] + 4) - 1) {
            puts(" }");
          }
          uVar8 = uVar8 + 1;
          if ((long)pVVar2->nSize <= (long)uVar7) goto LAB_0062723a;
        }
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)pVVar2->nSize);
    }
  }
  return local_38;
}

Assistant:

Aig_Man_t * Saig_ManIsoReduce( Aig_Man_t * pAig, Vec_Ptr_t ** pvPosEquivs, int fVerbose )
{ 
    Aig_Man_t * pPart;
    abctime clk = Abc_Clock();
    pPart = Iso_ManFilterPos( pAig, pvPosEquivs, fVerbose );
    printf( "Reduced %d outputs to %d outputs.  ", Saig_ManPoNum(pAig), Saig_ManPoNum(pPart) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVerbose && *pvPosEquivs && Saig_ManPoNum(pAig) != Vec_PtrSize(*pvPosEquivs) )
    {
        printf( "Nontrivial classes:\n" );
        Vec_VecPrintInt( (Vec_Vec_t *)*pvPosEquivs, 1 );
    }
//    Aig_ManStopP( &pPart );
    return pPart;
}